

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *node_1;
  MemoryAccountantAllocationNode *node;
  size_t size_local;
  MemoryAccountant *this_local;
  
  if ((this->useCacheSizes_ & 1U) == 0) {
    for (node_1 = this->head_; node_1 != (MemoryAccountantAllocationNode *)0x0;
        node_1 = node_1->next_) {
      if (node_1->size_ == size) {
        return node_1;
      }
    }
  }
  else {
    for (node = this->head_; node != (MemoryAccountantAllocationNode *)0x0; node = node->next_) {
      if ((node->size_ < size) && (node->next_ == (MemoryAccountantAllocationNode *)0x0)) {
        return node;
      }
      if ((size <= node->size_) && ((node->next_->size_ == 0 || (size < node->next_->size_)))) {
        return node;
      }
    }
  }
  return (MemoryAccountantAllocationNode *)0x0;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findNodeOfSize(size_t size) const
{
    if (useCacheSizes_) {
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
            if (size > node->size_ && node->next_ == NULLPTR)
                return node;
            else if (size <= node->size_ && !(node->next_->size_ != 0 && node->next_->size_ <= size))
                return node;
        }
    }
    else
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
            if (node->size_ == size)
                return node;
    return NULLPTR;
}